

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O2

void Omega_h::anon_unknown_41::promote(LO size,Int dim,any *lhs,any *rhs)

{
  bool bVar1;
  type_info *ptVar2;
  type_info *ptVar3;
  ScopedTimer local_29;
  
  begin_code("promote(size, dim, lhs, rhs)",(char *)0x0);
  ScopedTimer::~ScopedTimer(&local_29);
  if (dim == 1) {
    ptVar3 = (type_info *)&void::typeinfo;
    ptVar2 = (type_info *)&void::typeinfo;
    if (lhs->vtable != (vtable_type *)0x0) {
      ptVar2 = (*lhs->vtable->type)();
    }
    if (rhs->vtable != (vtable_type *)0x0) {
      ptVar3 = (*rhs->vtable->type)();
    }
    bVar1 = std::type_info::operator==(ptVar2,ptVar3);
    if (!bVar1) {
      promote_bools(size,lhs,rhs);
      promote_scalars(size,lhs,rhs);
      if (lhs->vtable == (vtable_type *)0x0) {
        ptVar2 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar2 = (*lhs->vtable->type)();
      }
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Vector<1>::typeinfo);
      if (bVar1) {
        if (rhs->vtable == (vtable_type *)0x0) {
          ptVar2 = (type_info *)&void::typeinfo;
        }
        else {
          ptVar2 = (*rhs->vtable->type)();
        }
        bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
        if (bVar1) {
          promote_vector<1>(size,lhs);
        }
      }
      if (lhs->vtable == (vtable_type *)0x0) {
        ptVar2 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar2 = (*lhs->vtable->type)();
      }
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
      if (bVar1) {
        if (rhs->vtable == (vtable_type *)0x0) {
          ptVar2 = (type_info *)&void::typeinfo;
        }
        else {
          ptVar2 = (*rhs->vtable->type)();
        }
        bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Vector<1>::typeinfo);
        if (bVar1) {
          promote_vector<1>(size,rhs);
        }
      }
      if (lhs->vtable == (vtable_type *)0x0) {
        ptVar2 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar2 = (*lhs->vtable->type)();
      }
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Matrix<1,1>::typeinfo);
      if (bVar1) {
        if (rhs->vtable == (vtable_type *)0x0) {
          ptVar2 = (type_info *)&void::typeinfo;
        }
        else {
          ptVar2 = (*rhs->vtable->type)();
        }
        bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
        if (bVar1) {
          promote_matrix<1>(size,lhs);
        }
      }
      if (lhs->vtable == (vtable_type *)0x0) {
        ptVar2 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar2 = (*lhs->vtable->type)();
      }
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
      if (bVar1) {
        if (rhs->vtable == (vtable_type *)0x0) {
          ptVar2 = (type_info *)&void::typeinfo;
        }
        else {
          ptVar2 = (*rhs->vtable->type)();
        }
        bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Matrix<1,1>::typeinfo);
        if (bVar1) {
          promote_matrix<1>(size,rhs);
        }
      }
    }
  }
  else if (dim == 2) {
    ptVar3 = (type_info *)&void::typeinfo;
    ptVar2 = (type_info *)&void::typeinfo;
    if (lhs->vtable != (vtable_type *)0x0) {
      ptVar2 = (*lhs->vtable->type)();
    }
    if (rhs->vtable != (vtable_type *)0x0) {
      ptVar3 = (*rhs->vtable->type)();
    }
    bVar1 = std::type_info::operator==(ptVar2,ptVar3);
    if (!bVar1) {
      promote_bools(size,lhs,rhs);
      promote_scalars(size,lhs,rhs);
      if (lhs->vtable == (vtable_type *)0x0) {
        ptVar2 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar2 = (*lhs->vtable->type)();
      }
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Vector<2>::typeinfo);
      if (bVar1) {
        if (rhs->vtable == (vtable_type *)0x0) {
          ptVar2 = (type_info *)&void::typeinfo;
        }
        else {
          ptVar2 = (*rhs->vtable->type)();
        }
        bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
        if (bVar1) {
          promote_vector<2>(size,lhs);
        }
      }
      if (lhs->vtable == (vtable_type *)0x0) {
        ptVar2 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar2 = (*lhs->vtable->type)();
      }
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
      if (bVar1) {
        if (rhs->vtable == (vtable_type *)0x0) {
          ptVar2 = (type_info *)&void::typeinfo;
        }
        else {
          ptVar2 = (*rhs->vtable->type)();
        }
        bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Vector<2>::typeinfo);
        if (bVar1) {
          promote_vector<2>(size,rhs);
        }
      }
      if (lhs->vtable == (vtable_type *)0x0) {
        ptVar2 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar2 = (*lhs->vtable->type)();
      }
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Matrix<2,2>::typeinfo);
      if (bVar1) {
        if (rhs->vtable == (vtable_type *)0x0) {
          ptVar2 = (type_info *)&void::typeinfo;
        }
        else {
          ptVar2 = (*rhs->vtable->type)();
        }
        bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
        if (bVar1) {
          promote_matrix<2>(size,lhs);
        }
      }
      if (lhs->vtable == (vtable_type *)0x0) {
        ptVar2 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar2 = (*lhs->vtable->type)();
      }
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
      if (bVar1) {
        if (rhs->vtable == (vtable_type *)0x0) {
          ptVar2 = (type_info *)&void::typeinfo;
        }
        else {
          ptVar2 = (*rhs->vtable->type)();
        }
        bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Matrix<2,2>::typeinfo);
        if (bVar1) {
          promote_matrix<2>(size,rhs);
        }
      }
    }
  }
  else {
    if (dim != 3) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp"
           ,0x5e);
    }
    ptVar3 = (type_info *)&void::typeinfo;
    ptVar2 = (type_info *)&void::typeinfo;
    if (lhs->vtable != (vtable_type *)0x0) {
      ptVar2 = (*lhs->vtable->type)();
    }
    if (rhs->vtable != (vtable_type *)0x0) {
      ptVar3 = (*rhs->vtable->type)();
    }
    bVar1 = std::type_info::operator==(ptVar2,ptVar3);
    if (!bVar1) {
      promote_bools(size,lhs,rhs);
      promote_scalars(size,lhs,rhs);
      if (lhs->vtable == (vtable_type *)0x0) {
        ptVar2 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar2 = (*lhs->vtable->type)();
      }
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Vector<3>::typeinfo);
      if (bVar1) {
        if (rhs->vtable == (vtable_type *)0x0) {
          ptVar2 = (type_info *)&void::typeinfo;
        }
        else {
          ptVar2 = (*rhs->vtable->type)();
        }
        bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
        if (bVar1) {
          promote_vector<3>(size,lhs);
        }
      }
      if (lhs->vtable == (vtable_type *)0x0) {
        ptVar2 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar2 = (*lhs->vtable->type)();
      }
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
      if (bVar1) {
        if (rhs->vtable == (vtable_type *)0x0) {
          ptVar2 = (type_info *)&void::typeinfo;
        }
        else {
          ptVar2 = (*rhs->vtable->type)();
        }
        bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Vector<3>::typeinfo);
        if (bVar1) {
          promote_vector<3>(size,rhs);
        }
      }
      if (lhs->vtable == (vtable_type *)0x0) {
        ptVar2 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar2 = (*lhs->vtable->type)();
      }
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Matrix<3,3>::typeinfo);
      if (bVar1) {
        if (rhs->vtable == (vtable_type *)0x0) {
          ptVar2 = (type_info *)&void::typeinfo;
        }
        else {
          ptVar2 = (*rhs->vtable->type)();
        }
        bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
        if (bVar1) {
          promote_matrix<3>(size,lhs);
        }
      }
      if (lhs->vtable == (vtable_type *)0x0) {
        ptVar2 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar2 = (*lhs->vtable->type)();
      }
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
      if (bVar1) {
        if (rhs->vtable == (vtable_type *)0x0) {
          ptVar2 = (type_info *)&void::typeinfo;
        }
        else {
          ptVar2 = (*rhs->vtable->type)();
        }
        bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Matrix<3,3>::typeinfo);
        if (bVar1) {
          promote_matrix<3>(size,rhs);
        }
      }
    }
  }
  return;
}

Assistant:

void promote(LO size, Int dim, any& lhs, any& rhs) {
  ScopedTimer("promote(size, dim, lhs, rhs)");
  if (dim == 3)
    promote<3>(size, lhs, rhs);
  else if (dim == 2)
    promote<2>(size, lhs, rhs);
  else if (dim == 1)
    promote<1>(size, lhs, rhs);
  else {
    OMEGA_H_NORETURN();
  }
}